

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O1

void nuts_scratch_addr(char *scheme,size_t sz,char *addr)

{
  uint16_t uVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  char *pcVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar10;
  char *pcVar11;
  undefined8 local_38;
  undefined4 extraout_var_01;
  
  iVar2 = strcmp(scheme,"inproc");
  if ((iVar2 == 0) || (iVar2 = strcmp(scheme,"abstract"), iVar2 == 0)) {
    uVar4 = nng_random();
    uVar6 = nng_random();
    uVar7 = nng_random();
    uVar8 = nng_random();
    snprintf(addr,sz,"%s://nuts%04x%04x%04x%04x",scheme,uVar4,(ulong)uVar6,(ulong)uVar7,(ulong)uVar8
            );
  }
  else {
    iVar2 = strncmp(scheme,"tcp",3);
    if ((iVar2 == 0) ||
       ((iVar2 = strncmp(scheme,"tls",3), iVar2 == 0 ||
        (iVar2 = strncmp(scheme,"udp",3), iVar2 == 0)))) {
      pcVar9 = strchr(scheme,0x36);
      pcVar11 = "[::1]";
      if (pcVar9 == (char *)0x0) {
        pcVar11 = "127.0.0.1";
      }
      uVar1 = nuts_next_port();
      snprintf(addr,sz,"%s://%s:%u",scheme,pcVar11,(ulong)uVar1);
      return;
    }
    iVar2 = strncmp(scheme,"ws",2);
    if (iVar2 == 0) {
      pcVar11 = strchr(scheme,0x36);
      pcVar9 = "[::1]";
      if (pcVar11 == (char *)0x0) {
        pcVar9 = "127.0.0.1";
      }
      uVar1 = nuts_next_port();
      uVar3 = (uint)uVar1;
      uVar4 = nng_random();
      local_38 = CONCAT44(extraout_var_00,uVar4);
      uVar4 = nng_random();
      uVar10 = CONCAT44(extraout_var_01,uVar4);
      uVar5 = nng_random();
      nng_random();
      pcVar11 = "%s://%s:%u/nuts%04x%04x%04x%04x";
    }
    else {
      iVar2 = strncmp(scheme,"ipc",3);
      if ((iVar2 != 0) && (iVar2 = strncmp(scheme,"unix",4), iVar2 != 0)) {
        nng_log_err("NUTS","Unknown scheme");
        abort();
      }
      pcVar9 = getenv("TMPDIR");
      if ((pcVar9 == (char *)0x0) && (pcVar9 = getenv("TEMP"), pcVar9 == (char *)0x0)) {
        pcVar11 = getenv("TMP");
        pcVar9 = "/tmp";
        if (pcVar11 != (char *)0x0) {
          pcVar9 = pcVar11;
        }
      }
      uVar3 = nng_random();
      uVar4 = nng_random();
      local_38 = CONCAT44(extraout_var,uVar4);
      uVar4 = nng_random();
      uVar10 = (ulong)uVar4;
      uVar5 = nng_random();
      pcVar11 = "%s://%s/nuts%04x%04x%04x%04x";
    }
    snprintf(addr,sz,pcVar11,scheme,pcVar9,(ulong)uVar3,local_38,uVar10,(ulong)uVar5);
  }
  return;
}

Assistant:

void
nuts_scratch_addr(const char *scheme, size_t sz, char *addr)
{
	if ((strcmp(scheme, "inproc") == 0) ||
	    (strcmp(scheme, "abstract") == 0)) {
		(void) snprintf(addr, sz, "%s://nuts%04x%04x%04x%04x", scheme,
		    nng_random(), nng_random(), nng_random(), nng_random());
		return;
	}

	if ((strncmp(scheme, "tcp", 3) == 0) ||
	    (strncmp(scheme, "tls", 3) == 0) ||
	    (strncmp(scheme, "udp", 3) == 0)) {
		const char *ip =
		    strchr(scheme, '6') != NULL ? "[::1]" : "127.0.0.1";
		(void) snprintf(
		    addr, sz, "%s://%s:%u", scheme, ip, nuts_next_port());
		return;
	}

	if (strncmp(scheme, "ws", 2) == 0) {
		const char *ip =
		    strchr(scheme, '6') != NULL ? "[::1]" : "127.0.0.1";
		(void) snprintf(addr, sz, "%s://%s:%u/nuts%04x%04x%04x%04x",
		    scheme, ip, nuts_next_port(), nng_random(), nng_random(),
		    nng_random(), nng_random());
		return;
	}

	if ((strncmp(scheme, "ipc", 3) == 0) ||
	    (strncmp(scheme, "unix", 4) == 0)) {
#ifdef _WIN32
		// Windows doesn't place IPC names in the filesystem.
		(void) snprintf(addr, sz, "%s://nuts%04x%04x%04x%04x", scheme,
		    nng_random(), nng_random(), nng_random(), nng_random());
		return;
#else
		char *tmpdir;

		if (((tmpdir = getenv("TMPDIR")) == NULL) &&
		    ((tmpdir = getenv("TEMP")) == NULL) &&
		    ((tmpdir = getenv("TMP")) == NULL)) {
			tmpdir = "/tmp";
		}

		(void) snprintf(addr, sz, "%s://%s/nuts%04x%04x%04x%04x",
		    scheme, tmpdir, nng_random(), nng_random(), nng_random(),
		    nng_random());
		return;
#endif
	}

	// We should not be here.
	nng_log_err("NUTS", "Unknown scheme");
	abort();
}